

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O3

void * xmlNanoFTPOpen(char *URL)

{
  int iVar1;
  void *ctx;
  
  xmlNanoFTPInit();
  if (((URL != (char *)0x0) && (iVar1 = strncmp("ftp://",URL,6), iVar1 == 0)) &&
     (ctx = xmlNanoFTPNewCtxt(URL), ctx != (void *)0x0)) {
    iVar1 = xmlNanoFTPConnect(ctx);
    if ((-1 < iVar1) && (iVar1 = xmlNanoFTPGetSocket(ctx,*(char **)((long)ctx + 0x18)), iVar1 != -1)
       ) {
      return ctx;
    }
    xmlNanoFTPFreeCtxt(ctx);
  }
  return (void *)0x0;
}

Assistant:

void*
xmlNanoFTPOpen(const char *URL) {
    xmlNanoFTPCtxtPtr ctxt;
    SOCKET sock;

    xmlNanoFTPInit();
    if (URL == NULL) return(NULL);
    if (strncmp("ftp://", URL, 6)) return(NULL);

    ctxt = (xmlNanoFTPCtxtPtr) xmlNanoFTPNewCtxt(URL);
    if (ctxt == NULL) return(NULL);
    if (xmlNanoFTPConnect(ctxt) < 0) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    sock = xmlNanoFTPGetSocket(ctxt, ctxt->path);
    if (sock == INVALID_SOCKET) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}